

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O1

DdNode * cuddZddWeakDiv(DdManager *dd,DdNode *f,DdNode *g)

{
  DdHalfWord v;
  DdNode *data;
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *gd;
  DdNode *fd;
  DdNode *g1;
  DdNode *g0;
  DdNode *f1;
  DdNode *f0;
  DdNode *local_60;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar2 = dd->one;
  if (pDVar2 == g) {
    return f;
  }
  data = dd->zero;
  if (pDVar2 == f || data == f) {
    return data;
  }
  if (f == g) {
    return pDVar2;
  }
  pDVar2 = cuddCacheLookup2Zdd(dd,cuddZddWeakDiv,f,g);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  v = g->index;
  iVar1 = cuddZddGetCofactors3(dd,f,v,&local_40,&local_38,&local_58);
  if (iVar1 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_40);
  Cudd_Ref(local_38);
  pDVar2 = local_58;
  Cudd_Ref(local_58);
  iVar1 = cuddZddGetCofactors3(dd,g,v,&local_50,&local_48,&local_60);
  if (iVar1 != 0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38);
    n_01 = pDVar2;
    goto LAB_0079f664;
  }
  Cudd_Ref(local_50);
  Cudd_Ref(local_48);
  n_01 = local_60;
  Cudd_Ref(local_60);
  n = g;
  if ((local_48 != data) && (n = cuddZddWeakDiv(dd,local_38,local_48), n == (DdNode *)0x0)) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    Cudd_RecursiveDerefZdd(dd,local_50);
    pDVar2 = local_48;
    goto LAB_0079f83e;
  }
  Cudd_Ref(n);
  Cudd_RecursiveDerefZdd(dd,local_38);
  Cudd_RecursiveDerefZdd(dd,local_48);
  if (n == data) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    goto LAB_0079f902;
  }
  if (local_50 != data) {
    Cudd_RecursiveDerefZdd(dd,n);
    n_00 = cuddZddWeakDiv(dd,local_40,local_50);
    if (n_00 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_50);
    }
    else {
      Cudd_Ref(n_00);
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_50);
      if (n == g) goto LAB_0079f855;
      n = cuddZddIntersect(dd,n,n_00);
      if (n != (DdNode *)0x0) {
        Cudd_Ref(n);
        local_50 = n_00;
        goto LAB_0079f817;
      }
    }
LAB_0079f83e:
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    goto LAB_0079f664;
  }
  Cudd_RecursiveDerefZdd(dd,local_40);
LAB_0079f817:
  Cudd_RecursiveDerefZdd(dd,local_50);
  n_00 = n;
LAB_0079f855:
  if (n_00 == data) {
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    n = n_00;
LAB_0079f902:
    Cudd_RecursiveDerefZdd(dd,n_01);
    cuddCacheInsert2(dd,cuddZddWeakDiv,f,g,data);
    Cudd_Deref(n);
    return data;
  }
  if (n_01 == data) {
    Cudd_RecursiveDerefZdd(dd,pDVar2);
  }
  else {
    Cudd_RecursiveDerefZdd(dd,n_00);
    n_01 = cuddZddWeakDiv(dd,local_58,local_60);
    if (n_01 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      n_01 = local_60;
LAB_0079f664:
      Cudd_RecursiveDerefZdd(dd,n_01);
      return (DdNode *)0x0;
    }
    Cudd_Ref(n_01);
    Cudd_RecursiveDerefZdd(dd,local_58);
    Cudd_RecursiveDerefZdd(dd,local_60);
    if (n_00 == g) goto LAB_0079f959;
    n_00 = cuddZddIntersect(dd,n_00,n_01);
    if (n_00 == (DdNode *)0x0) goto LAB_0079f664;
    Cudd_Ref(n_00);
  }
  Cudd_RecursiveDerefZdd(dd,n_01);
  n_01 = n_00;
LAB_0079f959:
  cuddCacheInsert2(dd,cuddZddWeakDiv,f,g,n_01);
  Cudd_Deref(n_01);
  return n_01;
}

Assistant:

DdNode  *
cuddZddWeakDiv(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *q, *tmp;
    DdNode      *r;
    int         flag;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddWeakDiv, f, g);
    if (r)
        return(r);

    v = g->index;

    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);

    q = g;

    if (g0 != zero) {
        q = cuddZddWeakDiv(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(q);
    }
    else
        Cudd_Ref(q);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (g1 != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDiv(dd, f1, g1);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, fd);
                Cudd_RecursiveDerefZdd(dd, gd);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
    }

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (gd != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDiv(dd, fd, gd);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, tmp);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
    }

    cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, q);
    Cudd_Deref(q);
    return(q);

}